

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall higan::TcpConnection::~TcpConnection(TcpConnection *this)

{
  LogLevel LVar1;
  undefined8 uVar2;
  Fmt local_328;
  Logger local_228;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  local_10 = this;
  Channel::DisableAll(&this->channel_);
  if (((this->connecting_ & 1U) != 0) && (LVar1 = Logger::GetLogLevel(), (int)LVar1 < 3)) {
    Logger::Logger(&local_228,WARN,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/TcpConnection.cpp"
                   ,0x1f,"~TcpConnection");
    uVar2 = std::__cxx11::string::c_str();
    Fmt::Fmt(&local_328,"connection: %s closed by destructor",uVar2);
    Logger::operator<<(&local_228,&local_328);
    Logger::~Logger(&local_228);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~map(&this->context_map_);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::~function
            (&this->write_over_callback_);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::~function
            (&this->new_connection_callback_);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::~function
            (&this->error_callback_);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&,_higan::Buffer_*)>::~function
            (&this->message_callback_);
  Buffer::~Buffer(&this->output_buffer_);
  Buffer::~Buffer(&this->input_buffer_);
  Channel::~Channel(&this->channel_);
  Socket::~Socket(&this->socket_);
  std::__cxx11::string::~string((string *)&this->connection_name_);
  std::enable_shared_from_this<higan::TcpConnection>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<higan::TcpConnection>);
  return;
}

Assistant:

TcpConnection::~TcpConnection()
{
	channel_.DisableAll();

	if (connecting_)
	{
		LOG_WARN << higan::Fmt("connection: %s closed by destructor", connection_name_.c_str());
	}
}